

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O2

QPlatformMenu * __thiscall
QMenuBarPrivate::findInsertionPlatformMenu(QMenuBarPrivate *this,QAction *action)

{
  QWidget *this_00;
  qsizetype qVar1;
  int iVar2;
  QPlatformMenu *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QAction_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  iVar2 = indexOf(this,action);
  lVar4 = (long)iVar2;
  pQVar3 = (QPlatformMenu *)0x0;
  while (lVar4 = lVar4 + 1, pQVar3 == (QPlatformMenu *)0x0) {
    QWidget::actions((QList<QAction_*> *)&local_50,this_00);
    qVar1 = local_50.size;
    QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_50);
    if (qVar1 <= lVar4) break;
    QWidget::actions((QList<QAction_*> *)&local_50,this_00);
    pQVar3 = getPlatformMenu(this,local_50.ptr[lVar4]);
    QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformMenu *QMenuBarPrivate::findInsertionPlatformMenu(const QAction *action)
{
    Q_Q(QMenuBar);
    QPlatformMenu *beforeMenu = nullptr;
    for (int beforeIndex = indexOf(const_cast<QAction *>(action)) + 1;
         !beforeMenu && (beforeIndex < q->actions().size());
         ++beforeIndex) {
        beforeMenu = getPlatformMenu(q->actions().at(beforeIndex));
    }

    return beforeMenu;
}